

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGenericPoolAllocator.cpp
# Opt level: O1

bool __thiscall btGenericPoolAllocator::freeMemory(btGenericPoolAllocator *this,void *pointer)

{
  btGenericMemoryPool *pbVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  
  if (this->m_pool_count != 0) {
    uVar3 = 1;
    do {
      pbVar1 = this->m_pools[uVar3 - 1];
      if (pointer < *(void **)pbVar1) {
        bVar4 = false;
      }
      else {
        uVar2 = (long)pointer - (long)*(void **)pbVar1;
        bVar4 = uVar2 < *(ulong *)(pbVar1 + 0x30) * *(ulong *)(pbVar1 + 0x28);
        if (bVar4) {
          *(ulong *)(*(ulong *)(pbVar1 + 8) + *(ulong *)(pbVar1 + 0x20) * 8) =
               uVar2 / *(ulong *)(pbVar1 + 0x28);
          *(ulong *)(pbVar1 + 0x20) = *(ulong *)(pbVar1 + 0x20) + 1;
          bVar4 = true;
        }
      }
    } while ((!bVar4) && (bVar5 = uVar3 < this->m_pool_count, uVar3 = uVar3 + 1, bVar5));
    if (bVar4) {
      return true;
    }
  }
  btAlignedFreeInternal(pointer);
  return true;
}

Assistant:

bool btGenericPoolAllocator::freeMemory(void * pointer)
{
	bool result = false;

	size_t i = 0;
	while(i<m_pool_count && result == false)
	{
		result = m_pools[i]->freeMemory(pointer);
		++i;
	}

	if(result) return true;

	return failback_free(pointer);
}